

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int GetCharPressed(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = CORE.Input.Keyboard.charPressedQueue[0];
  if (0 < CORE.Input.Keyboard.charPressedQueueCount) {
    lVar2 = 1;
    if (CORE.Input.Keyboard.charPressedQueueCount != 1) {
      lVar3 = 0;
      do {
        CORE.Input.Keyboard.charPressedQueue[lVar3] =
             *(int *)(CORE.Input.Mouse.currentButtonState + lVar3 * 4 + -0x5e);
        lVar3 = lVar3 + 1;
        lVar2 = (long)CORE.Input.Keyboard.charPressedQueueCount;
      } while (lVar3 < lVar2 + -1);
    }
    CORE.Input.Keyboard.charPressedQueue[lVar2] = 0;
    CORE.Input.Keyboard.charPressedQueueCount = CORE.Input.Keyboard.charPressedQueueCount + -1;
    return iVar1;
  }
  return 0;
}

Assistant:

int GetCharPressed(void)
{
    int value = 0;

    if (CORE.Input.Keyboard.charPressedQueueCount > 0)
    {
        // Get character from the queue head
        value = CORE.Input.Keyboard.charPressedQueue[0];

        // Shift elements 1 step toward the head.
        for (int i = 0; i < (CORE.Input.Keyboard.charPressedQueueCount - 1); i++)
            CORE.Input.Keyboard.charPressedQueue[i] = CORE.Input.Keyboard.charPressedQueue[i + 1];

        // Reset last character in the queue
        CORE.Input.Keyboard.charPressedQueue[CORE.Input.Keyboard.charPressedQueueCount] = 0;
        CORE.Input.Keyboard.charPressedQueueCount--;
    }

    return value;
}